

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

Type * get_struct_union_type(Denotation_Prototype *prototype)

{
  Type *pTVar1;
  Type *type;
  
  prototype->denotation = DT_Object;
  pTVar1 = (Type *)calloc(1,0x20);
  pTVar1->specifier = prototype->specifier;
  *(Struct_Union **)(pTVar1 + 1) = prototype->struct_union;
  *(byte *)&pTVar1[1].node = prototype->field_0x48 & 3 | *(byte *)&pTVar1[1].node & 0xfc;
  pTVar1 = type_check_and_push(pTVar1,prototype->node,0x20);
  if (((prototype->constraint == TC_NONE) && (prototype->sign == TSIGN_NONE)) &&
     ((prototype->specifier | TS_INT) == TS_UNION)) {
    return pTVar1;
  }
  type = (Type *)calloc(1,0x18);
  type->specifier = TS_ERROR;
  *(Type **)(type + 1) = pTVar1;
  pTVar1 = type_check_and_push(type,pTVar1->node,0x18);
  return pTVar1;
}

Assistant:

struct Type* get_struct_union_type(struct Denotation_Prototype *prototype)
{
	struct Type_Struct_Union *ret;
	
	assert(prototype->denotation=DT_Prototype);
	prototype->denotation=DT_Object;

	ret=calloc(1,sizeof(struct Type_Struct_Union));
	ret->specifier=prototype->specifier;
	ret->struct_union=prototype->struct_union;

	ret->is_const=prototype->is_const;
	ret->is_volatile=prototype->is_volatile;

	ret=(struct Type_Struct_Union*)type_check_and_push((struct Type*)ret,prototype->node,sizeof(struct Type_Struct_Union));
	if(prototype->constraint!=TC_NONE || prototype->sign!=TSIGN_NONE || (prototype->specifier!=TS_UNION && prototype->specifier!=TS_STRUCT))
	{
		return get_type_error((struct Type*)ret);
	}else
	{
		return (struct Type*)ret;
	}
}